

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O0

void anon_unknown.dwarf_6f3d8::dump_header_class
               (MetaClass *top,ofstream *file,string *exportExpression)

{
  string *file_00;
  bool bVar1;
  QLoggingCategory *pQVar2;
  char *pcVar3;
  ofstream *poVar4;
  element_type *top_00;
  long lVar5;
  ostream *poVar6;
  QDebug *pQVar7;
  size_type t;
  element_type *peVar8;
  string local_150;
  __shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_130;
  shared_ptr<MetaClass> *child_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1_2;
  string local_f0;
  __shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_d0;
  shared_ptr<MetaClass> *child_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1_1;
  QDebug local_90 [15];
  bool local_81;
  __shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  bool qt_category_enabled_1;
  shared_ptr<MetaClass> *child;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1;
  QMessageLogger local_50;
  QDebug local_30 [15];
  bool local_21;
  string *psStack_20;
  bool qt_category_enabled;
  string *exportExpression_local;
  ofstream *file_local;
  MetaClass *top_local;
  
  psStack_20 = exportExpression;
  exportExpression_local = (string *)file;
  file_local = (ofstream *)top;
  pQVar2 = dumpQSettingsHeader();
  local_21 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_21 != false) {
    pQVar2 = dumpQSettingsHeader();
    pcVar3 = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger(&local_50,(char *)0x0,0,(char *)0x0,pcVar3);
    QMessageLogger::debug();
    QDebug::operator<<(local_30,"Dumping class header");
    QDebug::~QDebug(local_30);
    local_21 = false;
  }
  poVar4 = file_local + 0x18;
  __end1 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
           begin((vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *
                 )poVar4);
  child = (shared_ptr<MetaClass> *)
          std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::end
                    ((vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                      *)poVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                                     *)&child), bVar1) {
    p_Stack_80 = &__gnu_cxx::
                  __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                  ::operator*(&__end1)->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>;
    top_00 = std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::get(p_Stack_80);
    dump_header_class(top_00,(ofstream *)exportExpression_local,psStack_20);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)exportExpression_local,"class ");
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    poVar6 = std::operator<<((ostream *)exportExpression_local,(string *)psStack_20);
    std::operator<<(poVar6," ");
  }
  poVar6 = std::operator<<((ostream *)exportExpression_local,(string *)(file_local + 0x40));
  poVar6 = std::operator<<(poVar6," : public QObject {");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)exportExpression_local,"\tQ_OBJECT");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pQVar2 = dumpQSettingsHeader();
  local_81 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_81 != false) {
    pQVar2 = dumpQSettingsHeader();
    pcVar3 = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger((QMessageLogger *)&__range1_1,(char *)0x0,0,(char *)0x0,pcVar3);
    QMessageLogger::debug();
    pQVar7 = QDebug::operator<<(local_90,"Class has:");
    t = std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ::size((vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                *)file_local);
    pQVar7 = QDebug::operator<<(pQVar7,t);
    QDebug::operator<<(pQVar7,"properties.");
    QDebug::~QDebug(local_90);
    local_81 = false;
  }
  dump_header_q_properties
            ((ofstream *)exportExpression_local,
             (vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
              *)file_local);
  poVar4 = file_local + 0x18;
  __end1_1 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
             begin((vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                    *)poVar4);
  child_1 = (shared_ptr<MetaClass> *)
            std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
            end((vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *)
                poVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                             *)&child_1), bVar1) {
    local_d0 = (__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
               ::operator*(&__end1_1);
    poVar6 = std::operator<<((ostream *)exportExpression_local,"Q_PROPERTY(QObject* ");
    peVar8 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_d0);
    camel_case_to_underscore(&local_f0,&peVar8->name);
    poVar6 = std::operator<<(poVar6,(string *)&local_f0);
    poVar6 = std::operator<<(poVar6," MEMBER _");
    peVar8 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_d0);
    decapitalize((string *)&__range1_2,&peVar8->name,0);
    poVar6 = std::operator<<(poVar6,(string *)&__range1_2);
    poVar6 = std::operator<<(poVar6," CONSTANT)");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&__range1_2);
    std::__cxx11::string::~string((string *)&local_f0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
    ::operator++(&__end1_1);
  }
  std::ostream::operator<<((ostream *)exportExpression_local,std::endl<char,std::char_traits<char>>)
  ;
  poVar6 = std::operator<<((ostream *)exportExpression_local,"public:");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(file_local + 0x30));
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)exportExpression_local,"\t");
    poVar6 = std::operator<<(poVar6,(string *)(file_local + 0x40));
    poVar6 = std::operator<<(poVar6,"(QObject *parent);");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar6 = std::operator<<((ostream *)exportExpression_local,"\tvoid sync();");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)exportExpression_local,"\tvoid load();");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)exportExpression_local,"\tstatic ");
    poVar6 = std::operator<<(poVar6,(string *)(file_local + 0x40));
    poVar6 = std::operator<<(poVar6,"* self();");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  poVar6 = std::operator<<((ostream *)exportExpression_local,"\t void loadDefaults();");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar4 = file_local + 0x18;
  __end1_2 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
             begin((vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                    *)poVar4);
  child_2 = (shared_ptr<MetaClass> *)
            std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
            end((vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *)
                poVar4);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                             *)&child_2), bVar1) {
    local_130 = (__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                ::operator*(&__end1_2);
    poVar6 = std::operator<<((ostream *)exportExpression_local,"\t");
    peVar8 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_130);
    poVar6 = std::operator<<(poVar6,(string *)&peVar8->name);
    poVar6 = std::operator<<(poVar6," *");
    peVar8 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_130);
    decapitalize(&local_150,&peVar8->name,0);
    poVar6 = std::operator<<(poVar6,(string *)&local_150);
    poVar6 = std::operator<<(poVar6,"() const;");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_150);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
    ::operator++(&__end1_2);
  }
  dump_header_properties
            ((ofstream *)exportExpression_local,
             (vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
              *)file_local,true);
  file_00 = exportExpression_local;
  poVar4 = file_local + 0x18;
  bVar1 = std::
          vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>::
          empty((vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                 *)file_local);
  dump_header_subclasses
            ((ofstream *)file_00,
             (vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *)
             poVar4,(bool)((bVar1 ^ 0xffU) & 1));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(file_local + 0x30));
  if (!bVar1) {
    bVar1 = std::
            vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>::
            empty((vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                   *)file_local);
    if ((!bVar1) ||
       (bVar1 = std::
                vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
                empty((vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                       *)(file_local + 0x18)), bVar1)) {
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)exportExpression_local,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"private:");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    poVar6 = std::operator<<((ostream *)exportExpression_local,"\t");
    poVar6 = std::operator<<(poVar6,(string *)(file_local + 0x40));
    poVar6 = std::operator<<(poVar6,"();");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  poVar6 = std::operator<<((ostream *)exportExpression_local,"};");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void dump_header_class(
    MetaClass *top,
    std::ofstream &file,
    const std::string &exportExpression)
{

  qCDebug(dumpKConfigHeader) << "Dumping class header";
  for (auto &&child : top->subclasses) {
    dump_header_class(child.get(), file, exportExpression);
  }

  file << "class ";

  if (exportExpression.size() != 0) {
    file << exportExpression << " ";
  }

  file << top->name << " : public QObject {" << std::endl;
  file << "\tQ_OBJECT" << std::endl;

  // Q_PROPERTY declarations
  qCDebug(dumpKConfigHeader) << "Class has:" << top->properties.size()
                      << "properties.";
  dump_header_q_properties(file, top->properties);

  for (auto &&child : top->subclasses) {
    file << "Q_PROPERTY(QObject* " << camel_case_to_underscore(child->name)
         << " MEMBER _" << decapitalize(child->name, 0) << " CONSTANT)"
         << std::endl;
  }

  file << std::endl;
  file << "public:" << std::endl;
  if (top->parent) {
    file << "\t" << top->name << "(QObject *parent = 0);" << std::endl;
  } else {
    file << "\tvoid sync();" << std::endl;
    file << "\tvoid load();" << std::endl;
    file << "\tstatic " << top->name << "* self();" << std::endl;
  }

  file << "\t void loadDefaults();" << std::endl;

  for (auto &&child : top->subclasses) {
    file << "\t" << child->name << " *" << decapitalize(child->name, 0)
         << "() const;" << std::endl;
  }

  dump_header_properties(file, top->properties);
  dump_header_subclasses(file, top->subclasses, !top->properties.empty());

  if (!top->parent) {
    if (!top->properties.empty() || top->subclasses.empty()) {
      file << std::endl << "private:" << std::endl;
    }
    file << "\t" << top->name << "(QObject *parent = 0);" << std::endl;
  }
  file << "};" << std::endl << std::endl;
}